

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

string * include_file(string *__return_storage_ptr__,string *filename)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long *plVar4;
  long *plVar5;
  pointer pcVar6;
  uint uVar7;
  pointer pbVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sp;
  string sfilename;
  stat finfo;
  char rp [4096];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10f8;
  string *local_10f0;
  long *local_10e8;
  long local_10e0;
  long local_10d8;
  long lStack_10d0;
  stat local_10c8;
  undefined1 *local_1038 [2];
  undefined1 local_1028 [4088];
  
  pcVar2 = (filename->_M_dataplus)._M_p;
  if (*pcVar2 == '/') {
    pcVar2 = realpath(pcVar2,(char *)local_1038);
    if (pcVar2 == (char *)0x0) {
      pcVar6 = (filename->_M_dataplus)._M_p;
      pcVar2 = "Cannot open include file %s\n";
      goto LAB_0012730d;
    }
    iVar1 = stat((char *)local_1038,&local_10c8);
    if (iVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      sVar3 = strlen((char *)local_1038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_1038,(long)local_1038 + sVar3);
      return __return_storage_ptr__;
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1110,&g_incl_searchpath_abi_cxx11_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&local_1110,
             (const_iterator)
             local_1110.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&g_curdir_abi_cxx11_);
    if (local_1110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_1110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1110);
    }
    else {
      local_10f8 = &__return_storage_ptr__->field_2;
      pbVar8 = local_1110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_10f0 = filename;
      do {
        pcVar6 = (pbVar8->_M_dataplus)._M_p;
        local_1038[0] = local_1028;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1038,pcVar6,pcVar6 + pbVar8->_M_string_length);
        std::__cxx11::string::append((char *)local_1038);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_1038,(ulong)(filename->_M_dataplus)._M_p);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_10d8 = *plVar5;
          lStack_10d0 = plVar4[3];
          local_10e8 = &local_10d8;
        }
        else {
          local_10d8 = *plVar5;
          local_10e8 = (long *)*plVar4;
        }
        local_10e0 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (local_1038[0] != local_1028) {
          operator_delete(local_1038[0]);
        }
        pcVar2 = realpath((char *)local_10e8,(char *)local_1038);
        if (pcVar2 == (char *)0x0) {
          uVar7 = 4;
        }
        else {
          iVar1 = stat((char *)local_1038,&local_10c8);
          uVar7 = 0;
          if (iVar1 == 0) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_10f8;
            sVar3 = strlen((char *)local_1038);
            filename = local_10f0;
            uVar7 = 1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,(string *)local_1038,
                       (long)local_1038 + sVar3);
          }
        }
        if (local_10e8 != &local_10d8) {
          operator_delete(local_10e8);
        }
        if ((uVar7 & 3) != 0) goto LAB_001272d9;
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != local_1110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      uVar7 = 0;
LAB_001272d9:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1110);
      if (uVar7 != 0) {
        return __return_storage_ptr__;
      }
    }
  }
  pcVar6 = (filename->_M_dataplus)._M_p;
  pcVar2 = "Could not find include file %s\n";
LAB_0012730d:
  pwarning(0,pcVar2,pcVar6);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string include_file(string filename) {
    // Absolute path? Just try that
    if (filename[0] == '/') {
        // Realpath!
        char rp[THRIFT_PATH_MAX];
        // cppcheck-suppress uninitvar
        if (saferealpath(filename.c_str(), rp) == nullptr) {
            pwarning(0, "Cannot open include file %s\n", filename.c_str());
            return std::string();
        }

        // Stat this file
        struct stat finfo;
        if (stat(rp, &finfo) == 0) {
            return rp;
        }
    } else { // relative path, start searching
        // new search path with current dir global
        vector<string> sp = g_incl_searchpath;
        sp.insert(sp.begin(), g_curdir);

        // iterate through paths
        vector<string>::iterator it;
        for (it = sp.begin(); it != sp.end(); it++) {
            string sfilename = *(it) + "/" + filename;

            // Realpath!
            char rp[THRIFT_PATH_MAX];
            // cppcheck-suppress uninitvar
            if (saferealpath(sfilename.c_str(), rp) == nullptr) {
                continue;
            }

            // Stat this files
            struct stat finfo;
            if (stat(rp, &finfo) == 0) {
                return rp;
            }
        }
    }

    // Uh oh
    pwarning(0, "Could not find include file %s\n", filename.c_str());
    return std::string();
}